

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteBoolArray
               (bool *a,int n,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteRaw(output,a,n);
  return;
}

Assistant:

void WireFormatLite::WriteBoolArray(const bool* a, int n,
                                    io::CodedOutputStream* output) {
  WriteArray<bool>(a, n, output);
}